

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall cmFindLibraryHelper::CheckDirectory(cmFindLibraryHelper *this,string *path)

{
  bool bVar1;
  reference name;
  Name *i;
  iterator __end1;
  iterator __begin1;
  vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_> *__range1;
  string *path_local;
  cmFindLibraryHelper *this_local;
  
  __end1 = std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::begin
                     (&this->Names);
  i = (Name *)std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
              end(&this->Names);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
                                *)&i);
    if (!bVar1) {
      return false;
    }
    name = __gnu_cxx::
           __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
           ::operator*(&__end1);
    bVar1 = CheckDirectoryForName(this,path,name);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectory(std::string const& path)
{
  for (Name& i : this->Names) {
    if (this->CheckDirectoryForName(path, i)) {
      return true;
    }
  }
  return false;
}